

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  char cVar2;
  long lVar3;
  uchar uVar4;
  cJSON_bool cVar5;
  cJSON_bool cVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  uchar *puVar10;
  size_t i;
  ulong uVar11;
  ulong uVar12;
  uchar uVar13;
  size_t needed;
  long lVar14;
  cJSON *item_00;
  cJSON *pcVar15;
  size_t needed_00;
  long in_FS_OFFSET;
  double local_60;
  uchar number_buffer [26];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  cVar6 = 0;
  cVar5 = 0;
  if (output_buffer != (printbuffer *)0x0 && item != (cJSON *)0x0) {
    cVar2 = (char)item->type;
    cVar5 = cVar6;
    switch(cVar2) {
    case '\x01':
      puVar10 = ensure(output_buffer,6);
      if (puVar10 != (uchar *)0x0) {
        builtin_memcpy(puVar10,"false",6);
LAB_0010302d:
        cVar5 = 1;
      }
      break;
    case '\x02':
      puVar10 = ensure(output_buffer,5);
      if (puVar10 != (uchar *)0x0) {
        builtin_memcpy(puVar10,"true",5);
        goto LAB_0010302d;
      }
      break;
    case '\x03':
    case '\x05':
    case '\x06':
    case '\a':
      break;
    case '\x04':
      puVar10 = ensure(output_buffer,5);
      if (puVar10 != (uchar *)0x0) {
        builtin_memcpy(puVar10,"null",5);
        goto LAB_0010302d;
      }
      break;
    case '\b':
      dVar1 = item->valuedouble;
      uVar4 = get_decimal_point();
      if ((dVar1 * 0.0 != 0.0) || (NAN(dVar1 * 0.0))) {
        builtin_memcpy(number_buffer,"null",5);
        uVar7 = 4;
LAB_00102f80:
        uVar11 = (ulong)uVar7;
        puVar10 = ensure(output_buffer,uVar11);
        if (puVar10 != (uchar *)0x0) {
          for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
            uVar13 = number_buffer[uVar12];
            if (uVar13 == uVar4) {
              uVar13 = '.';
            }
            puVar10[uVar12] = uVar13;
          }
          puVar10[uVar11] = '\0';
          output_buffer->offset = output_buffer->offset + uVar11;
          goto LAB_0010302d;
        }
      }
      else {
        uVar7 = sprintf((char *)number_buffer,"%1.15g");
        iVar8 = __isoc99_sscanf(number_buffer,"%lg",&local_60);
        if (iVar8 == 1) {
          if ((local_60 != dVar1) || (NAN(local_60) || NAN(dVar1))) goto LAB_00102f60;
        }
        else {
LAB_00102f60:
          uVar7 = sprintf((char *)number_buffer,"%1.17g");
        }
        if (uVar7 < 0x1a) goto LAB_00102f80;
      }
LAB_0010301d:
      cVar5 = 0;
      break;
    default:
      if (cVar2 == '\x10') {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
          cVar5 = print_string_ptr((uchar *)item->valuestring,output_buffer);
          return cVar5;
        }
        goto LAB_0010304f;
      }
      if (cVar2 == ' ') {
        pcVar15 = item->child;
        puVar10 = ensure(output_buffer,1);
        if (puVar10 != (uchar *)0x0) {
          *puVar10 = '[';
          output_buffer->offset = output_buffer->offset + 1;
          output_buffer->depth = output_buffer->depth + 1;
          while (item_00 = pcVar15, item_00 != (cJSON *)0x0) {
            cVar6 = print_value(item_00,output_buffer);
            cVar5 = 0;
            if (cVar6 == 0) goto switchD_00102c4e_caseD_3;
            update_offset(output_buffer);
            pcVar15 = (cJSON *)0x0;
            if (item_00->next != (cJSON *)0x0) {
              uVar11 = (ulong)(output_buffer->format == 0);
              puVar10 = ensure(output_buffer,uVar11 ^ 3);
              if (puVar10 == (uchar *)0x0) goto switchD_00102c4e_caseD_3;
              *puVar10 = ',';
              if (output_buffer->format == 0) {
                puVar10 = puVar10 + 1;
              }
              else {
                puVar10[1] = ' ';
                puVar10 = puVar10 + 2;
              }
              *puVar10 = '\0';
              output_buffer->offset = output_buffer->offset + (2 - uVar11);
              pcVar15 = item_00->next;
            }
          }
          puVar10 = ensure(output_buffer,2);
          if (puVar10 != (uchar *)0x0) {
            puVar10[0] = ']';
            puVar10[1] = '\0';
LAB_00103029:
            output_buffer->depth = output_buffer->depth - 1;
            goto LAB_0010302d;
          }
          goto LAB_0010301d;
        }
      }
      else if (cVar2 == '@') {
        pcVar15 = item->child;
        uVar11 = (ulong)(output_buffer->format == 0);
        puVar10 = ensure(output_buffer,uVar11 ^ 3);
        if (puVar10 != (uchar *)0x0) {
          needed_00 = 2;
          *puVar10 = '{';
          output_buffer->depth = output_buffer->depth + 1;
          if (output_buffer->format != 0) {
            puVar10[1] = '\n';
          }
          output_buffer->offset = output_buffer->offset + (2 - uVar11);
          cVar5 = 0;
          for (; pcVar15 != (cJSON *)0x0; pcVar15 = pcVar15->next) {
            if (output_buffer->format != 0) {
              puVar10 = ensure(output_buffer,output_buffer->depth);
              if (puVar10 == (uchar *)0x0) goto LAB_0010301d;
              for (uVar11 = 0; uVar11 < output_buffer->depth; uVar11 = uVar11 + 1) {
                puVar10[uVar11] = '\t';
              }
              output_buffer->offset = output_buffer->offset + output_buffer->depth;
            }
            cVar6 = print_string_ptr((uchar *)pcVar15->string,output_buffer);
            if (cVar6 == 0) goto switchD_00102c4e_caseD_3;
            update_offset(output_buffer);
            needed = 2 - (ulong)(output_buffer->format == 0);
            puVar10 = ensure(output_buffer,needed);
            if (puVar10 == (uchar *)0x0) goto switchD_00102c4e_caseD_3;
            *puVar10 = ':';
            if (output_buffer->format != 0) {
              puVar10[1] = '\t';
            }
            output_buffer->offset = output_buffer->offset + needed;
            cVar6 = print_value(pcVar15,output_buffer);
            if (cVar6 == 0) goto switchD_00102c4e_caseD_3;
            update_offset(output_buffer);
            lVar14 = ((ulong)(pcVar15->next != (cJSON *)0x0) + 1) -
                     (ulong)(output_buffer->format == 0);
            puVar10 = ensure(output_buffer,lVar14 + 1);
            if (puVar10 == (uchar *)0x0) goto switchD_00102c4e_caseD_3;
            if (pcVar15->next != (cJSON *)0x0) {
              *puVar10 = ',';
              puVar10 = puVar10 + 1;
            }
            if (output_buffer->format != 0) {
              *puVar10 = '\n';
              puVar10 = puVar10 + 1;
            }
            *puVar10 = '\0';
            output_buffer->offset = output_buffer->offset + lVar14;
          }
          if (output_buffer->format != 0) {
            needed_00 = output_buffer->depth + 1;
          }
          puVar10 = ensure(output_buffer,needed_00);
          if (puVar10 != (uchar *)0x0) {
            if (output_buffer->format != 0) {
              for (uVar11 = 0; uVar11 < output_buffer->depth - 1; uVar11 = uVar11 + 1) {
                puVar10[uVar11] = '\t';
              }
              puVar10 = puVar10 + uVar11;
            }
            puVar10[0] = '}';
            puVar10[1] = '\0';
            goto LAB_00103029;
          }
          goto LAB_0010301d;
        }
      }
      else {
        cVar5 = 0;
        if (cVar2 == -0x80) {
          if (item->valuestring == (char *)0x0) {
            cVar5 = cVar6;
            if (output_buffer->noalloc == 0) {
              (*(output_buffer->hooks).deallocate)(output_buffer->buffer);
            }
          }
          else {
            sVar9 = strlen(item->valuestring);
            puVar10 = ensure(output_buffer,sVar9 + 1);
            cVar5 = cVar6;
            if (puVar10 != (uchar *)0x0) {
              memcpy(puVar10,item->valuestring,sVar9 + 1);
              goto LAB_0010302d;
            }
          }
        }
      }
    }
  }
switchD_00102c4e_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return cVar5;
  }
LAB_0010304f:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                if (!output_buffer->noalloc)
                {
                    output_buffer->hooks.deallocate(output_buffer->buffer);
                }
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}